

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateStructArgs
          (SwiftGenerator *this,StructDef *struct_def,string *code_ptr,string *nameprefix,
          string *object_name,string *obj_api_named,bool is_obj_api)

{
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined4 local_1bc;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string type;
  string field_field;
  string field_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Value *local_68;
  Type *field_type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_50;
  const_iterator it;
  string *code;
  bool is_obj_api_local;
  string *obj_api_named_local;
  string *object_name_local;
  string *nameprefix_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  SwiftGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  local_50._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_50,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_50);
    field_type = (Type *)*ppFVar2;
    if ((((FieldDef *)field_type)->deprecated & 1U) == 0) {
      local_68 = &((FieldDef *)field_type)->value;
      bVar1 = IsStruct(&(((FieldDef *)field_type)->value).type);
      if (bVar1) {
        struct_def_00 = (local_68->type).struct_def;
        std::operator+(&local_88,nameprefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       field_type);
        std::operator+(&local_c8,object_name,".");
        std::operator+(&local_a8,&local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       field_type);
        GenerateStructArgs(this,struct_def_00,code_ptr,&local_88,&local_a8,obj_api_named,is_obj_api)
        ;
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        IdlNamer::Variable_abi_cxx11_
                  ((string *)((long)&field_field.field_2 + 8),&this->namer_,(FieldDef *)field_type);
        IdlNamer::Field_abi_cxx11_
                  ((string *)((long)&type.field_2 + 8),&this->namer_,(FieldDef *)field_type);
        GenType_abi_cxx11_((string *)local_138,this,(Type *)&field_type[6].struct_def,false);
        if (is_obj_api) {
          std::operator+(&local_280,nameprefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_field.field_2 + 8));
          std::operator+(&local_260,&local_280,": ");
          std::operator+(&local_240,&local_260,obj_api_named);
          std::operator+(&local_220,&local_240,object_name);
          std::operator+(&local_200,&local_220,".");
          std::operator+(&local_1e0,&local_200,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&type.field_2 + 8));
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::operator+=((string *)it._M_current,", ");
          local_1bc = 0;
        }
        else {
          std::operator+(&local_198,nameprefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_field.field_2 + 8));
          std::operator+(&local_178,&local_198,": ");
          std::operator+(&local_158,&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138);
          std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          bVar1 = IsEnum((Type *)&field_type[6].struct_def);
          if (!bVar1) {
            std::__cxx11::string::operator+=((string *)it._M_current," = ");
            SwiftConstant_abi_cxx11_(&local_1b8,this,(FieldDef *)field_type);
            std::__cxx11::string::operator+=((string *)it._M_current,(string *)&local_1b8);
            std::__cxx11::string::~string((string *)&local_1b8);
          }
          std::__cxx11::string::operator+=((string *)it._M_current,", ");
          local_1bc = 4;
        }
        std::__cxx11::string::~string((string *)local_138);
        std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(field_field.field_2._M_local_buf + 8));
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_50);
  }
  return;
}

Assistant:

void GenerateStructArgs(const StructDef &struct_def, std::string *code_ptr,
                          const std::string &nameprefix,
                          const std::string &object_name,
                          const std::string &obj_api_named = "",
                          bool is_obj_api = false) {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto &field_type = field.value.type;
      if (IsStruct(field.value.type)) {
        GenerateStructArgs(
            *field_type.struct_def, code_ptr, (nameprefix + field.name),
            (object_name + "." + field.name), obj_api_named, is_obj_api);
      } else {
        const auto field_var = namer_.Variable(field);
        const auto field_field = namer_.Field(field);
        const auto type = GenType(field.value.type);
        if (!is_obj_api) {
          code += nameprefix + field_var + ": " + type;
          if (!IsEnum(field.value.type)) {
            code += " = ";
            code += SwiftConstant(field);
          }
          code += ", ";
          continue;
        }
        code += nameprefix + field_var + ": " + obj_api_named + object_name +
                "." + field_field;
        code += ", ";
      }
    }
  }